

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O3

void __thiscall
BRTS<UFPC>::FindRuns(BRTS<UFPC> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  ulong *puVar9;
  unsigned_short uVar10;
  Run *pRVar11;
  ulong uVar12;
  uint uVar13;
  Run *pRVar14;
  short sVar15;
  ulong *puVar16;
  ulong uVar17;
  Run *pRVar18;
  unsigned_short uVar19;
  Run *pRVar20;
  long lVar21;
  
  puVar6 = UFPC::P_;
  lVar8 = (long)data_width;
  uVar17 = *bits_start;
  sVar15 = 0;
  puVar16 = bits_start;
  pRVar14 = runs;
  while( true ) {
    for (; uVar17 != 0; uVar17 = (~uVar17 >> ((byte)lVar3 & 0x3f)) << ((byte)lVar3 & 0x3f)) {
      lVar3 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      pRVar14->start_pos = (short)lVar3 + sVar15;
      uVar17 = (~uVar17 >> ((byte)lVar3 & 0x3f)) << ((byte)lVar3 & 0x3f);
      if (uVar17 == 0) {
        do {
          sVar15 = sVar15 + 0x40;
          puVar9 = puVar16 + 1;
          puVar16 = puVar16 + 1;
        } while (*puVar9 == 0xffffffffffffffff);
        uVar17 = ~*puVar9;
      }
      lVar3 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      pRVar14->end_pos = (short)lVar3 + sVar15;
      puVar6[UFPC::length_] = UFPC::length_;
      uVar13 = UFPC::length_ + 1;
      pRVar14->label = UFPC::length_;
      UFPC::length_ = uVar13;
      pRVar14 = pRVar14 + 1;
    }
    puVar16 = puVar16 + 1;
    if (puVar16 == bits_start + lVar8) break;
    sVar15 = sVar15 + 0x40;
    uVar17 = *puVar16;
  }
  pRVar14->start_pos = 0xffff;
  pRVar14->end_pos = 0xffff;
  if (1 < height) {
    uVar17 = 1;
    do {
      pRVar11 = pRVar14 + 1;
      puVar16 = bits_start + uVar17 * lVar8;
      puVar9 = puVar16 + lVar8;
      uVar12 = *puVar16;
      lVar3 = 0;
      pRVar14 = pRVar11;
      while( true ) {
        for (; uVar12 != 0; uVar12 = ~uVar12 & -1L << ((byte)lVar5 & 0x3f)) {
          lVar4 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar12 = (~uVar12 >> ((byte)lVar4 & 0x3f)) << ((byte)lVar4 & 0x3f);
          lVar21 = lVar3;
          if (uVar12 == 0) {
            do {
              lVar21 = lVar21 + 0x40;
              puVar1 = puVar16 + 1;
              puVar16 = puVar16 + 1;
            } while (*puVar1 == 0xffffffffffffffff);
            uVar12 = ~*puVar1;
          }
          lVar5 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar19 = (unsigned_short)(lVar3 + lVar4);
          pRVar20 = runs + -1;
          do {
            pRVar18 = pRVar20;
            runs = runs + 1;
            uVar2 = pRVar18[1].end_pos;
            pRVar20 = pRVar18 + 1;
          } while ((uint)uVar2 < ((uint)(lVar3 + lVar4) & 0xffff));
          uVar10 = (unsigned_short)(lVar5 + lVar21);
          uVar13 = (uint)(lVar5 + lVar21) & 0xffff;
          if (uVar13 < pRVar20->start_pos) {
            pRVar14->start_pos = uVar19;
            pRVar14->end_pos = uVar10;
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar7 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          else {
            uVar7 = UFPC::P_[pRVar18[1].label];
            while ((pRVar18 = runs, uVar2 < uVar13 &&
                   (pRVar20 = pRVar18, pRVar18->start_pos <= uVar13))) {
              if (uVar7 != UFPC::P_[pRVar18->label]) {
                uVar7 = UFPC::Merge(uVar7,UFPC::P_[pRVar18->label]);
              }
              uVar2 = pRVar18->end_pos;
              runs = pRVar18 + 1;
            }
            pRVar14->start_pos = uVar19;
            pRVar14->end_pos = uVar10;
          }
          pRVar14->label = uVar7;
          pRVar14 = pRVar14 + 1;
          lVar3 = lVar21;
          runs = pRVar20;
        }
        puVar16 = puVar16 + 1;
        if (puVar16 == puVar9) break;
        uVar12 = *puVar16;
        lVar3 = lVar3 + 0x40;
      }
      pRVar14->start_pos = 0xffff;
      pRVar14->end_pos = 0xffff;
      uVar17 = uVar17 + 1;
      runs = pRVar11;
    } while (uVar17 != (uint)height);
  }
  puVar6 = UFPC::P_;
  uVar13 = 1;
  if (1 < UFPC::length_) {
    uVar13 = 1;
    uVar17 = 1;
    do {
      if (puVar6[uVar17] < uVar17) {
        uVar7 = puVar6[puVar6[uVar17]];
      }
      else {
        uVar7 = uVar13;
        uVar13 = uVar13 + 1;
      }
      puVar6[uVar17] = uVar7;
      uVar17 = uVar17 + 1;
    } while (uVar17 < UFPC::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  return;
}

Assistant:

void FindRuns(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);

            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::GetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::Merge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }